

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_region.h
# Opt level: O0

bool __thiscall
S2ShapeIndexRegion<MutableS2ShapeIndex>::MayIntersect
          (S2ShapeIndexRegion<MutableS2ShapeIndex> *this,S2Cell *target)

{
  Iterator *this_00;
  Iterator *it;
  S2ClippedShape *clipped_00;
  int iVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  S2Point local_a8;
  S2ClippedShape *local_90;
  S2ClippedShape *clipped;
  S2ShapeIndexCell *pSStack_80;
  int s;
  S2ShapeIndexCell *cell;
  S2CellId local_6c;
  byte local_51;
  S2LogMessage local_50;
  S2LogMessageVoidify local_3d;
  uint64 local_3c;
  S2CellId local_34;
  uint64 local_2c;
  CellRelation local_24;
  S2Cell *pSStack_20;
  CellRelation relation;
  S2Cell *target_local;
  S2ShapeIndexRegion<MutableS2ShapeIndex> *this_local;
  
  this_00 = this->iter_;
  pSStack_20 = target;
  target_local = (S2Cell *)this;
  local_2c = (uint64)S2Cell::id(target);
  local_24 = MutableS2ShapeIndex::Iterator::Locate(this_00,(S2CellId)local_2c);
  if (local_24 == DISJOINT) {
    this_local._7_1_ = false;
  }
  else if (local_24 == SUBDIVIDED) {
    this_local._7_1_ = true;
  }
  else {
    local_34 = S2ShapeIndex::IteratorBase::id(&this->iter_->super_IteratorBase);
    local_3c = (uint64)S2Cell::id(pSStack_20);
    bVar2 = S2CellId::contains(&local_34,(S2CellId)local_3c);
    local_51 = 0;
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shape_index_region.h"
                 ,0x128,kFatal,(ostream *)&std::cerr);
      local_51 = 1;
      poVar4 = S2LogMessage::stream(&local_50);
      poVar4 = std::operator<<(poVar4,"Check failed: iter_.id().contains(target.id()) ");
      S2LogMessageVoidify::operator&(&local_3d,poVar4);
    }
    if ((local_51 & 1) != 0) {
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_50);
    }
    local_6c = S2ShapeIndex::IteratorBase::id(&this->iter_->super_IteratorBase);
    register0x00000000 = S2Cell::id(pSStack_20);
    bVar2 = ::operator==(local_6c,register0x00000000);
    if (bVar2) {
      this_local._7_1_ = true;
    }
    else {
      pSStack_80 = MutableS2ShapeIndex::Iterator::cell(this->iter_);
      for (clipped._4_4_ = 0; iVar1 = clipped._4_4_,
          iVar3 = S2ShapeIndexCell::num_clipped(pSStack_80), iVar1 < iVar3;
          clipped._4_4_ = clipped._4_4_ + 1) {
        local_90 = S2ShapeIndexCell::clipped(pSStack_80,clipped._4_4_);
        bVar2 = AnyEdgeIntersects(this,local_90,pSStack_20);
        clipped_00 = local_90;
        if (bVar2) {
          return true;
        }
        it = this->iter_;
        S2Cell::GetCenter(&local_a8,pSStack_20);
        bVar2 = S2ContainsPointQuery<MutableS2ShapeIndex>::ShapeContains
                          (&this->contains_query_,it,clipped_00,&local_a8);
        if (bVar2) {
          return true;
        }
      }
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool S2ShapeIndexRegion<IndexType>::MayIntersect(const S2Cell& target) const {
  S2ShapeIndex::CellRelation relation = iter_.Locate(target.id());

  // If "target" does not overlap any index cell, there is no intersection.
  if (relation == S2ShapeIndex::DISJOINT) return false;

  // If "target" is subdivided into one or more index cells, then there is an
  // intersection to within the S2ShapeIndex error bound.
  if (relation == S2ShapeIndex::SUBDIVIDED) return true;

  // Otherwise, the iterator points to an index cell containing "target".
  //
  // If "target" is an index cell itself, there is an intersection because index
  // cells are created only if they have at least one edge or they are
  // entirely contained by the loop.
  S2_DCHECK(iter_.id().contains(target.id()));
  if (iter_.id() == target.id()) return true;

  // Test whether any shape intersects the target cell or contains its center.
  const S2ShapeIndexCell& cell = iter_.cell();
  for (int s = 0; s < cell.num_clipped(); ++s) {
    const S2ClippedShape& clipped = cell.clipped(s);
    if (AnyEdgeIntersects(clipped, target)) return true;
    if (contains_query_.ShapeContains(iter_, clipped, target.GetCenter())) {
      return true;
    }
  }
  return false;
}